

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FastAndEffectiveFeaturePreservingMeshDenoising.cpp
# Opt level: O2

void __thiscall
FastAndEffectiveFeaturePreservingMeshDenoising::initParameters
          (FastAndEffectiveFeaturePreservingMeshDenoising *this)

{
  ParameterSet *pPVar1;
  string local_40;
  allocator local_19;
  
  ParameterSet::removeAllParameter((this->super_MeshDenoisingBase).parameter_set_);
  pPVar1 = (this->super_MeshDenoisingBase).parameter_set_;
  std::__cxx11::string::string((string *)&local_40,"Face Neighbor",&local_19);
  ParameterSet::addParameter(pPVar1,&local_40,0);
  std::__cxx11::string::~string((string *)&local_40);
  pPVar1 = (this->super_MeshDenoisingBase).parameter_set_;
  std::__cxx11::string::string((string *)&local_40,"Threshold T",&local_19);
  ParameterSet::addParameter(pPVar1,&local_40,0.5);
  std::__cxx11::string::~string((string *)&local_40);
  pPVar1 = (this->super_MeshDenoisingBase).parameter_set_;
  std::__cxx11::string::string((string *)&local_40,"Normal Iteration Num.",&local_19);
  ParameterSet::addParameter(pPVar1,&local_40,0x14);
  std::__cxx11::string::~string((string *)&local_40);
  pPVar1 = (this->super_MeshDenoisingBase).parameter_set_;
  std::__cxx11::string::string((string *)&local_40,"Vertex Iteration Num.",&local_19);
  ParameterSet::addParameter(pPVar1,&local_40,0x32);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void FastAndEffectiveFeaturePreservingMeshDenoising::initParameters()
{
    parameter_set_->removeAllParameter();

    parameter_set_->addParameter(string("Face Neighbor"), 0);

    parameter_set_->addParameter(string("Threshold T"), 0.5);

    parameter_set_->addParameter(string("Normal Iteration Num."), 20);

    parameter_set_->addParameter(string("Vertex Iteration Num."), 50);

}